

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int skip_mode_by_bsize_and_ref_frame
              (PREDICTION_MODE mode,MV_REFERENCE_FRAME ref_frame,BLOCK_SIZE bsize,int extra_prune,
              uint sse_zeromv_norm,int more_prune,int skip_nearmv)

{
  uint thresh_skip_golden;
  int more_prune_local;
  uint sse_zeromv_norm_local;
  int extra_prune_local;
  BLOCK_SIZE bsize_local;
  MV_REFERENCE_FRAME ref_frame_local;
  PREDICTION_MODE mode_local;
  int local_4;
  
  if (((ref_frame == '\x01') || (499 < sse_zeromv_norm)) || (mode != '\x10')) {
    if (((bsize == BLOCK_128X128) && (mode == '\x10')) || ((skip_nearmv != 0 && (mode == '\x0e'))))
    {
      local_4 = 1;
    }
    else {
      if (extra_prune != 0) {
        if (((1 < extra_prune) && (ref_frame != '\x01')) &&
           ((BLOCK_16X16 < bsize && (mode == '\x10')))) {
          return 1;
        }
        if ((ref_frame != '\x01') && (mode == '\x0e')) {
          return 1;
        }
        if (((more_prune != 0) && (BLOCK_32X16 < bsize)) && (mode == '\x0e')) {
          return 1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int skip_mode_by_bsize_and_ref_frame(
    PREDICTION_MODE mode, MV_REFERENCE_FRAME ref_frame, BLOCK_SIZE bsize,
    int extra_prune, unsigned int sse_zeromv_norm, int more_prune,
    int skip_nearmv) {
  const unsigned int thresh_skip_golden = 500;

  if (ref_frame != LAST_FRAME && sse_zeromv_norm < thresh_skip_golden &&
      mode == NEWMV)
    return 1;

  if ((bsize == BLOCK_128X128 && mode == NEWMV) ||
      (skip_nearmv && mode == NEARMV))
    return 1;

  // Skip testing non-LAST if this flag is set.
  if (extra_prune) {
    if (extra_prune > 1 && ref_frame != LAST_FRAME &&
        (bsize > BLOCK_16X16 && mode == NEWMV))
      return 1;

    if (ref_frame != LAST_FRAME && mode == NEARMV) return 1;

    if (more_prune && bsize >= BLOCK_32X32 && mode == NEARMV) return 1;
  }
  return 0;
}